

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O2

uc_afl_ret __thiscall UCAFL::_child_fuzz(UCAFL *this,bool afl_exist)

{
  uc_afl_cb_validate_crash_t p_Var1;
  bool bVar2;
  uc_afl_ret uVar3;
  uc_err uVar4;
  bool crash_found;
  uint uVar5;
  double __x;
  double dVar6;
  
  crash_found = false;
  bVar2 = true;
  uVar5 = 0;
  do {
    if (this->persistent_iters_ - 1 < uVar5) {
      if (!afl_exist) {
        return UC_AFL_RET_NO_AFL;
      }
      exit(0);
    }
    if (!bVar2) {
      uVar3 = _afl_next(this,crash_found);
      if (uVar3 != UC_AFL_RET_OK) {
        exit(1);
      }
      crash_found = false;
    }
    _may_use_mmap_testcase(this);
    bVar2 = (*this->place_input_callback_)
                      (this->uc_,(char *)this->afl_testcase_ptr_,(size_t)*this->afl_testcase_len_p_,
                       uVar5,this->data_);
    if (bVar2) {
      uVar4 = (*this->fuzz_callback_)(this->uc_,this->data_);
      dVar6 = (double)uc_strerror(uVar4);
      log(dVar6);
      p_Var1 = this->validate_crash_callback_;
      if (uVar4 == UC_ERR_OK) {
        if ((this->always_validate_ & p_Var1 != (uc_afl_cb_validate_crash_t)0x0) != 0) {
LAB_00103431:
          bVar2 = (*p_Var1)(this->uc_,uVar4,(char *)this->afl_testcase_ptr_,
                            *this->afl_testcase_len_p_,uVar5,this->data_);
          if (bVar2) goto LAB_0010344e;
        }
      }
      else {
        if (p_Var1 != (uc_afl_cb_validate_crash_t)0x0) goto LAB_00103431;
LAB_0010344e:
        crash_found = true;
        if (this->persistent_iters_ == 1) {
          dVar6 = (double)uc_strerror(uVar4);
          log(dVar6);
          fflush(_stderr);
          abort();
        }
      }
    }
    else {
      log(__x);
    }
    _may_unnmap_testcase(this);
    uVar5 = uVar5 + 1;
    bVar2 = false;
  } while( true );
}

Assistant:

uc_afl_ret _child_fuzz(bool afl_exist) {
        bool crash_found = false;
        bool first_round = true;
        bool input_accepted;
        uint32_t i = 0;

        for (i = 0; this->persistent_iters_ == 0 || i < this->persistent_iters_;
             i++) {
            if (unlikely(first_round)) {
                first_round = false;
            } else {
                if (this->_afl_next(crash_found) != UC_AFL_RET_OK) {
                    exit(1);
                }

                crash_found = false;
            }

            AFL_TESTCASE testcase(this);

            input_accepted = this->place_input_callback_(
                this->uc_, testcase.ptr(), testcase.len(), i, this->data_);

            if (unlikely(!input_accepted)) {
                ERR_CHILD("Input is not accepted.\n");
                continue;
            }

            uc_err uc_ret = this->fuzz_callback_(this->uc_, this->data_);

            ERR_CHILD("We are stopping for uc_err=%d (%s)\n", uc_ret,
                      uc_strerror(uc_ret));

            if (unlikely(uc_ret != UC_ERR_OK) ||
                (this->always_validate_ && this->validate_crash_callback_)) {

                if (this->validate_crash_callback_ &&
                    !this->validate_crash_callback_(
                        this->uc_, uc_ret, testcase.ptr(), testcase.len(), i,
                        this->data_)) {
                    continue;
                }

                if (this->persistent_iters_ != 1) {
                    crash_found = true;
                    continue;
                }

                ERR_CHILD("UC returned Error: '%s' - let's abort().\n",
                          uc_strerror(uc_ret));
                fflush(stderr);

                abort();
            }
        }

        // We are still in the child, nothing good will come after this.
        // Exit and let the next generation run.
        if (likely(afl_exist)) {
            exit(0);
        }

        // Just run once.
        return UC_AFL_RET_NO_AFL;
    }